

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O2

CURLcode Curl_is_connected(connectdata *conn,int sockindex,_Bool *connected)

{
  undefined1 *puVar1;
  Curl_easy *data;
  long lVar2;
  undefined8 uVar3;
  Curl_addrinfo *pCVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  undefined4 uVar8;
  int iVar9;
  _Bool _Var10;
  CURLcode CVar11;
  uint uVar12;
  timediff_t tVar13;
  int *piVar14;
  char *pcVar15;
  ulong uVar16;
  uint tempindex;
  long lVar17;
  curltime cVar18;
  curltime newer;
  curltime older;
  curltime older_00;
  int error;
  int local_1a0;
  CURLcode local_19c;
  curltime local_198;
  long local_188;
  _Bool *local_180;
  ulong local_178;
  ulong local_170;
  char ipaddress [46];
  char buffer [256];
  
  data = conn->data;
  error = 0;
  *connected = false;
  if ((conn->bits).tcpconnect[sockindex] == true) {
    *connected = true;
  }
  else {
    cVar18 = Curl_now();
    local_198.tv_sec = cVar18.tv_sec;
    local_198.tv_usec = cVar18.tv_usec;
    local_170 = Curl_timeleft(data,&local_198,true);
    if ((long)local_170 < 0) {
      Curl_failf(data,"Connection time-out");
      return CURLE_OPERATION_TIMEDOUT;
    }
    if ((conn->cnnct).state - CONNECT_SOCKS_INIT < 0x10) {
      CVar11 = connect_SOCKS(conn,sockindex,connected);
      if (CVar11 != CURLE_OK) {
        return CVar11;
      }
      if (*connected != true) {
        return CURLE_OK;
      }
LAB_0010e010:
      post_SOCKS(conn,sockindex,connected);
      return CURLE_OK;
    }
    local_19c = CURLE_OK;
    local_1a0 = sockindex;
    local_188 = (long)sockindex;
    local_180 = connected;
    for (lVar17 = 0; tempindex = (uint)lVar17, lVar17 != 2; lVar17 = lVar17 + 1) {
      if (conn->tempsock[lVar17] != -1) {
        error = 0;
        uVar12 = Curl_socket_check(-1,-1,conn->tempsock[lVar17],0);
        uVar16 = (ulong)(tempindex ^ 1);
        if (uVar12 == 2) {
LAB_0010de4a:
          _Var10 = verifyconnect(conn->tempsock[lVar17],&error);
          if (_Var10) {
            conn->sock[local_188] = conn->tempsock[lVar17];
            pCVar4 = conn->tempaddr[lVar17];
            conn->ip_addr = pCVar4;
            conn->tempsock[lVar17] = -1;
            *(ulong *)&(conn->bits).field_0x4 =
                 *(ulong *)&(conn->bits).field_0x4 & 0xffffffffffffdfff |
                 (ulong)(pCVar4->ai_family == 10) << 0xd;
            if (conn->tempsock[uVar16] != -1) {
              Curl_closesocket(conn,conn->tempsock[uVar16]);
              conn->tempsock[uVar16] = -1;
            }
            connected = local_180;
            sockindex = local_1a0;
            CVar11 = connect_SOCKS(conn,local_1a0,local_180);
            if (CVar11 != CURLE_OK) {
              return CVar11;
            }
            if (*connected != true) {
              return CURLE_OK;
            }
            goto LAB_0010e010;
          }
        }
        else if (uVar12 == 0) {
          cVar18.tv_usec = local_198.tv_usec;
          cVar18.tv_sec = local_198.tv_sec;
          uVar5 = (conn->connecttime).tv_sec;
          uVar6 = (conn->connecttime).tv_usec;
          older.tv_usec = uVar6;
          older.tv_sec = uVar5;
          cVar18._12_4_ = 0;
          older._12_4_ = 0;
          tVar13 = Curl_timediff(cVar18,older);
          if (conn->timeoutms_per_addr[lVar17] <= tVar13) {
            Curl_infof(data,"After %ldms connect time, move on!\n");
            error = 0x6e;
          }
          if (((lVar17 == 0) && ((*(ulong *)&(conn->bits).field_0x4 & 0x400000000) == 0)) &&
             (newer.tv_usec = local_198.tv_usec, newer.tv_sec = local_198.tv_sec,
             uVar7 = (conn->connecttime).tv_sec, uVar8 = (conn->connecttime).tv_usec,
             older_00.tv_usec = uVar8, older_00.tv_sec = uVar7, newer._12_4_ = 0,
             older_00._12_4_ = 0, tVar13 = Curl_timediff(newer,older_00),
             (data->set).happy_eyeballs_timeout <= tVar13)) {
            puVar1 = &(conn->bits).field_0x4;
            *(ulong *)puVar1 = *(ulong *)puVar1 | 0x400000000;
            trynextip(conn,local_1a0,1);
          }
        }
        else {
          if (((conn->bits).field_0x7 & 4) != 0) goto LAB_0010de4a;
          if ((uVar12 & 4) != 0) {
            verifyconnect(conn->tempsock[lVar17],&error);
          }
        }
        iVar9 = error;
        if (error != 0) {
          (data->state).os_errno = error;
          piVar14 = __errno_location();
          *piVar14 = iVar9;
          if (conn->tempaddr[lVar17] != (Curl_addrinfo *)0x0) {
            local_178 = uVar16;
            Curl_printable_address(conn->tempaddr[lVar17],ipaddress,0x2e);
            lVar2 = conn->port;
            pcVar15 = Curl_strerror(error,buffer,0x100);
            Curl_infof(data,"connect to %s port %ld failed: %s\n",ipaddress,lVar2,pcVar15);
            conn->timeoutms_per_addr[lVar17] =
                 local_170 >> (conn->tempaddr[lVar17]->ai_next != (Curl_addrinfo *)0x0);
            ainext(conn,tempindex,true);
            CVar11 = trynextip(conn,local_1a0,tempindex);
            if ((CVar11 != CURLE_COULDNT_CONNECT) || (conn->tempsock[local_178] == -1)) {
              local_19c = CVar11;
            }
          }
        }
      }
    }
    if (local_19c == CURLE_OK) {
      return CURLE_OK;
    }
    if (conn->tempsock[0] != -1) {
      return CURLE_OK;
    }
    if (conn->tempsock[1] != -1) {
      return CURLE_OK;
    }
    CVar11 = trynextip(conn,local_1a0,1);
    if (CVar11 != CURLE_OK) {
      uVar16 = *(ulong *)&(conn->bits).field_0x4;
      lVar17 = 0x390;
      if ((((uVar16 & 2) == 0) && (lVar17 = 0x3d0, (uVar16 & 1) == 0)) &&
         (lVar17 = 0x370, ((uint)uVar16 >> 8 & 1) == 0)) {
        lVar17 = 0x340;
      }
      uVar3 = *(undefined8 *)((conn->cnnct).socksreq + lVar17 + -0xc);
      lVar17 = conn->port;
      pcVar15 = Curl_strerror(error,buffer,0x100);
      Curl_failf(data,"Failed to connect to %s port %ld: %s",uVar3,lVar17,pcVar15);
      if ((data->state).os_errno != 0x6e) {
        return CVar11;
      }
      return CURLE_OPERATION_TIMEDOUT;
    }
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_is_connected(struct connectdata *conn,
                           int sockindex,
                           bool *connected)
{
  struct Curl_easy *data = conn->data;
  CURLcode result = CURLE_OK;
  timediff_t allow;
  int error = 0;
  struct curltime now;
  int rc = 0;
  unsigned int i;

  DEBUGASSERT(sockindex >= FIRSTSOCKET && sockindex <= SECONDARYSOCKET);

  *connected = FALSE; /* a very negative world view is best */

  if(conn->bits.tcpconnect[sockindex]) {
    /* we are connected already! */
    *connected = TRUE;
    return CURLE_OK;
  }

  now = Curl_now();

  /* figure out how long time we have left to connect */
  allow = Curl_timeleft(data, &now, TRUE);

  if(allow < 0) {
    /* time-out, bail out, go home */
    failf(data, "Connection time-out");
    return CURLE_OPERATION_TIMEDOUT;
  }

  if(SOCKS_STATE(conn->cnnct.state)) {
    /* still doing SOCKS */
    result = connect_SOCKS(conn, sockindex, connected);
    if(!result && *connected)
      post_SOCKS(conn, sockindex, connected);
    return result;
  }

  for(i = 0; i<2; i++) {
    const int other = i ^ 1;
    if(conn->tempsock[i] == CURL_SOCKET_BAD)
      continue;
    error = 0;
#ifdef ENABLE_QUIC
    if(conn->transport == TRNSPRT_QUIC) {
      result = Curl_quic_is_connected(conn, i, connected);
      if(!result && *connected) {
        /* use this socket from now on */
        conn->sock[sockindex] = conn->tempsock[i];
        conn->ip_addr = conn->tempaddr[i];
        conn->tempsock[i] = CURL_SOCKET_BAD;
        post_SOCKS(conn, sockindex, connected);
        connkeep(conn, "HTTP/3 default");
        return CURLE_OK;
      }
      if(result)
        error = SOCKERRNO;
    }
    else
#endif
    {
#ifdef mpeix
      /* Call this function once now, and ignore the results. We do this to
         "clear" the error state on the socket so that we can later read it
         reliably. This is reported necessary on the MPE/iX operating
         system. */
      (void)verifyconnect(conn->tempsock[i], NULL);
#endif

      /* check socket for connect */
      rc = SOCKET_WRITABLE(conn->tempsock[i], 0);
    }

    if(rc == 0) { /* no connection yet */
      if(Curl_timediff(now, conn->connecttime) >=
         conn->timeoutms_per_addr[i]) {
        infof(data, "After %" CURL_FORMAT_TIMEDIFF_T
              "ms connect time, move on!\n", conn->timeoutms_per_addr[i]);
        error = ETIMEDOUT;
      }

      /* should we try another protocol family? */
      if(i == 0 && !conn->bits.parallel_connect &&
         (Curl_timediff(now, conn->connecttime) >=
          data->set.happy_eyeballs_timeout)) {
        conn->bits.parallel_connect = TRUE; /* starting now */
        trynextip(conn, sockindex, 1);
      }
    }
    else if(rc == CURL_CSELECT_OUT || conn->bits.tcp_fastopen) {
      if(verifyconnect(conn->tempsock[i], &error)) {
        /* we are connected with TCP, awesome! */

        /* use this socket from now on */
        conn->sock[sockindex] = conn->tempsock[i];
        conn->ip_addr = conn->tempaddr[i];
        conn->tempsock[i] = CURL_SOCKET_BAD;
#ifdef ENABLE_IPV6
        conn->bits.ipv6 = (conn->ip_addr->ai_family == AF_INET6)?TRUE:FALSE;
#endif

        /* close the other socket, if open */
        if(conn->tempsock[other] != CURL_SOCKET_BAD) {
          Curl_closesocket(conn, conn->tempsock[other]);
          conn->tempsock[other] = CURL_SOCKET_BAD;
        }

        /* see if we need to kick off any SOCKS proxy magic once we
           connected */
        result = connect_SOCKS(conn, sockindex, connected);
        if(result || !*connected)
          return result;

        post_SOCKS(conn, sockindex, connected);

        return CURLE_OK;
      }
    }
    else if(rc & CURL_CSELECT_ERR) {
      (void)verifyconnect(conn->tempsock[i], &error);
    }

    /*
     * The connection failed here, we should attempt to connect to the "next
     * address" for the given host. But first remember the latest error.
     */
    if(error) {
      data->state.os_errno = error;
      SET_SOCKERRNO(error);
      if(conn->tempaddr[i]) {
        CURLcode status;
#ifndef CURL_DISABLE_VERBOSE_STRINGS
        char ipaddress[MAX_IPADR_LEN];
        char buffer[STRERROR_LEN];
        Curl_printable_address(conn->tempaddr[i], ipaddress,
                               sizeof(ipaddress));
        infof(data, "connect to %s port %ld failed: %s\n",
              ipaddress, conn->port,
              Curl_strerror(error, buffer, sizeof(buffer)));
#endif

        conn->timeoutms_per_addr[i] = conn->tempaddr[i]->ai_next == NULL ?
          allow : allow / 2;
        ainext(conn, i, TRUE);
        status = trynextip(conn, sockindex, i);
        if((status != CURLE_COULDNT_CONNECT) ||
           conn->tempsock[other] == CURL_SOCKET_BAD)
          /* the last attempt failed and no other sockets remain open */
          result = status;
      }
    }
  }

  if(result &&
     (conn->tempsock[0] == CURL_SOCKET_BAD) &&
     (conn->tempsock[1] == CURL_SOCKET_BAD)) {
    /* no more addresses to try */
    const char *hostname;
    char buffer[STRERROR_LEN];

    /* if the first address family runs out of addresses to try before the
       happy eyeball timeout, go ahead and try the next family now */
    result = trynextip(conn, sockindex, 1);
    if(!result)
      return result;

#ifndef CURL_DISABLE_PROXY
    if(conn->bits.socksproxy)
      hostname = conn->socks_proxy.host.name;
    else if(conn->bits.httpproxy)
      hostname = conn->http_proxy.host.name;
    else
#endif
      if(conn->bits.conn_to_host)
        hostname = conn->conn_to_host.name;
    else
      hostname = conn->host.name;

    failf(data, "Failed to connect to %s port %ld: %s",
          hostname, conn->port,
          Curl_strerror(error, buffer, sizeof(buffer)));

    Curl_quic_disconnect(conn, 0);
    Curl_quic_disconnect(conn, 1);

#ifdef WSAETIMEDOUT
    if(WSAETIMEDOUT == data->state.os_errno)
      result = CURLE_OPERATION_TIMEDOUT;
#elif defined(ETIMEDOUT)
    if(ETIMEDOUT == data->state.os_errno)
      result = CURLE_OPERATION_TIMEDOUT;
#endif
  }
  else
    result = CURLE_OK; /* still trying */

  return result;
}